

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void exprSetHeight(Expr *p)

{
  int iVar1;
  uint uVar2;
  Select *pSelect;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  int nHeight;
  int local_1c;
  
  local_1c = 0;
  if ((p->pLeft != (Expr *)0x0) && (iVar1 = p->pLeft->nHeight, 0 < iVar1)) {
    local_1c = iVar1;
  }
  if ((p->pRight != (Expr *)0x0) && (iVar1 = p->pRight->nHeight, local_1c < iVar1)) {
    local_1c = iVar1;
  }
  uVar2 = p->flags;
  pSelect = (Select *)(p->x).pList;
  if ((uVar2 >> 0xb & 1) == 0) {
    if (pSelect != (Select *)0x0) {
      heightOfExprList((ExprList *)pSelect,&local_1c);
      uVar4 = 0;
      uVar3 = (ulong)*(uint *)&pSelect->pEList;
      if ((int)*(uint *)&pSelect->pEList < 1) {
        uVar3 = uVar4;
      }
      uVar5 = 0;
      for (; uVar3 * 0x20 != uVar4; uVar4 = uVar4 + 0x20) {
        uVar5 = uVar5 | *(uint *)(*(long *)((long)pSelect->addrOpenEphm + (uVar4 - 0x14)) + 4);
      }
      p->flags = uVar5 & 0x200104 | uVar2;
    }
  }
  else {
    heightOfSelect(pSelect,&local_1c);
  }
  p->nHeight = local_1c + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = 0;
  heightOfExpr(p->pLeft, &nHeight);
  heightOfExpr(p->pRight, &nHeight);
  if( ExprHasProperty(p, EP_xIsSelect) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else if( p->x.pList ){
    heightOfExprList(p->x.pList, &nHeight);
    p->flags |= EP_Propagate & sqlite3ExprListFlags(p->x.pList);
  }
  p->nHeight = nHeight + 1;
}